

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkCaveat(GetConfigAttribSimpleCase *this,EGLint value)

{
  ostringstream *this_00;
  undefined1 local_190 [384];
  
  if ((0x19 < value - 0x3038U) || ((0x3000001U >> (value - 0x3038U & 0x1f) & 1) == 0)) {
    local_190._0_8_ =
         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Fail, invalid EGL_CONFIG_CAVEAT value");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkCaveat (EGLint value)
	{
		if (!(value == EGL_NONE || value == EGL_SLOW_CONFIG || value == EGL_NON_CONFORMANT_CONFIG))
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, invalid EGL_CONFIG_CAVEAT value" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}